

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O3

void secp256k1_hsort(void *ptr,size_t count,size_t size,_func_int_void_ptr_void_ptr_void_ptr *cmp,
                    void *cmp_data)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  ulong uVar13;
  uchar *b;
  void *pvVar14;
  undefined8 *puVar15;
  uchar *a;
  void *pvVar16;
  uchar *a_3;
  long lVar17;
  ulong uVar18;
  uchar *b_2;
  long lVar19;
  long lVar20;
  size_t sVar21;
  uchar *a_2;
  uchar tmp [64];
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 *local_58;
  undefined8 *local_50;
  void *local_48;
  undefined8 *local_40;
  long local_38;
  
  if (1 < count) {
    local_58 = (undefined8 *)(count >> 1);
    local_50 = local_58;
    local_48 = cmp_data;
    do {
      puVar15 = (undefined8 *)((long)local_58 + -1);
      local_58 = puVar15;
      if (puVar15 < local_50) {
        do {
          uVar18 = (long)puVar15 * 2;
          puVar11 = (undefined8 *)((long)puVar15 * 2 + 2);
          if (puVar11 < count) {
            pvVar14 = (void *)((long)puVar11 * size + (long)ptr);
            lVar19 = (uVar18 | 1) * size;
            local_40 = puVar11;
            iVar10 = (*cmp)(pvVar14,(void *)((long)ptr + lVar19),cmp_data);
            if (iVar10 < 0) goto LAB_0011832d;
            pvVar16 = (void *)((long)puVar15 * size + (long)ptr);
            iVar10 = (*cmp)(pvVar14,pvVar16,cmp_data);
            if (iVar10 < 1) break;
            sVar21 = size;
            if (0x40 < size) {
              lVar19 = (uVar18 + 3) * size;
              lVar17 = ((long)puVar15 + 1) * size;
              lVar20 = 0;
              do {
                puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x40);
                local_98 = *puVar15;
                uStack_90 = puVar15[1];
                puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x30);
                local_88 = *puVar15;
                uStack_80 = puVar15[1];
                puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x20);
                local_78 = *puVar15;
                uStack_70 = puVar15[1];
                puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x10);
                local_68 = *puVar15;
                uStack_60 = puVar15[1];
                puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x40);
                uVar3 = puVar15[1];
                puVar11 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x30);
                uVar4 = *puVar11;
                uVar5 = puVar11[1];
                puVar11 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x20);
                uVar6 = *puVar11;
                uVar7 = puVar11[1];
                puVar11 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x10);
                uVar8 = *puVar11;
                uVar9 = puVar11[1];
                puVar11 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x40);
                *puVar11 = *puVar15;
                puVar11[1] = uVar3;
                puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x10);
                *puVar15 = uVar8;
                puVar15[1] = uVar9;
                puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x20);
                *puVar15 = uVar6;
                puVar15[1] = uVar7;
                puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x30);
                *puVar15 = uVar4;
                puVar15[1] = uVar5;
                puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x10);
                *puVar15 = local_68;
                puVar15[1] = uStack_60;
                puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x20);
                *puVar15 = local_78;
                puVar15[1] = uStack_70;
                puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x30);
                *puVar15 = local_88;
                puVar15[1] = uStack_80;
                puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x40);
                *puVar15 = local_98;
                puVar15[1] = uStack_90;
                lVar1 = size + lVar20;
                lVar20 = lVar20 + -0x40;
              } while (0x40 < lVar1 - 0x40U);
              sVar21 = lVar20 + size;
            }
            memcpy(&local_98,pvVar16,sVar21);
            memmove(pvVar16,pvVar14,sVar21);
            memcpy(pvVar14,&local_98,sVar21);
            puVar15 = local_40;
          }
          else {
            lVar19 = (uVar18 | 1) * size;
LAB_0011832d:
            local_b0 = (undefined8 *)(uVar18 | 1);
            pvVar14 = (void *)((long)ptr + lVar19);
            pvVar16 = (void *)((long)puVar15 * size + (long)ptr);
            iVar10 = (*cmp)(pvVar14,pvVar16,cmp_data);
            if (iVar10 < 1) break;
            uVar18 = size;
            if (0x40 < size) {
              puVar15 = (undefined8 *)((long)ptr + ((long)puVar15 + 1) * size + -0x40);
              sVar21 = size;
              do {
                uVar18 = sVar21 - 0x40;
                local_98 = *puVar15;
                uStack_90 = puVar15[1];
                local_88 = puVar15[2];
                uStack_80 = puVar15[3];
                local_78 = puVar15[4];
                uStack_70 = puVar15[5];
                local_68 = puVar15[6];
                uStack_60 = puVar15[7];
                puVar11 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x40);
                uVar3 = puVar11[1];
                puVar12 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x30);
                uVar4 = *puVar12;
                uVar5 = puVar12[1];
                puVar12 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x20);
                uVar6 = *puVar12;
                uVar7 = puVar12[1];
                puVar12 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x10);
                uVar8 = *puVar12;
                uVar9 = puVar12[1];
                *puVar15 = *puVar11;
                puVar15[1] = uVar3;
                puVar15[6] = uVar8;
                puVar15[7] = uVar9;
                puVar15[4] = uVar6;
                puVar15[5] = uVar7;
                puVar15[2] = uVar4;
                puVar15[3] = uVar5;
                puVar11 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x10);
                *puVar11 = local_68;
                puVar11[1] = uStack_60;
                puVar11 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x20);
                *puVar11 = local_78;
                puVar11[1] = uStack_70;
                puVar11 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x30);
                *puVar11 = local_88;
                puVar11[1] = uStack_80;
                puVar11 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x40);
                *puVar11 = local_98;
                puVar11[1] = uStack_90;
                puVar15 = puVar15 + -8;
                sVar21 = uVar18;
              } while (0x40 < uVar18);
            }
            memcpy(&local_98,pvVar16,uVar18);
            memmove(pvVar16,pvVar14,uVar18);
            memcpy(pvVar14,&local_98,uVar18);
            puVar15 = local_b0;
          }
          cmp_data = local_48;
        } while (puVar15 < local_50);
      }
    } while (local_58 != (undefined8 *)0x0);
    puVar15 = (undefined8 *)((long)ptr + size * count + -0x40);
    local_38 = -size;
    local_a8 = (undefined8 *)count;
    do {
      puVar11 = puVar15;
      uVar13 = size;
      uVar18 = size;
      if (0x40 < size) {
        do {
          uVar18 = uVar13 - 0x40;
          puVar12 = (undefined8 *)((long)ptr + (uVar13 - 0x40));
          local_98 = *puVar12;
          uStack_90 = puVar12[1];
          puVar12 = (undefined8 *)((long)ptr + (uVar13 - 0x30));
          local_88 = *puVar12;
          uStack_80 = puVar12[1];
          puVar12 = (undefined8 *)((long)ptr + (uVar13 - 0x20));
          local_78 = *puVar12;
          uStack_70 = puVar12[1];
          puVar12 = (undefined8 *)((long)ptr + (uVar13 - 0x10));
          local_68 = *puVar12;
          uStack_60 = puVar12[1];
          uVar3 = puVar11[1];
          uVar4 = puVar11[2];
          uVar5 = puVar11[3];
          uVar6 = puVar11[4];
          uVar7 = puVar11[5];
          uVar8 = puVar11[6];
          uVar9 = puVar11[7];
          puVar12 = (undefined8 *)((long)ptr + (uVar13 - 0x40));
          *puVar12 = *puVar11;
          puVar12[1] = uVar3;
          puVar12 = (undefined8 *)((long)ptr + (uVar13 - 0x10));
          *puVar12 = uVar8;
          puVar12[1] = uVar9;
          puVar12 = (undefined8 *)((long)ptr + (uVar13 - 0x20));
          *puVar12 = uVar6;
          puVar12[1] = uVar7;
          puVar12 = (undefined8 *)((long)ptr + (uVar13 - 0x30));
          *puVar12 = uVar4;
          puVar12[1] = uVar5;
          puVar11[6] = local_68;
          puVar11[7] = uStack_60;
          puVar11[4] = local_78;
          puVar11[5] = uStack_70;
          puVar11[2] = local_88;
          puVar11[3] = uStack_80;
          *puVar11 = local_98;
          puVar11[1] = uStack_90;
          puVar11 = puVar11 + -8;
          uVar13 = uVar18;
        } while (0x40 < uVar18);
      }
      puVar11 = (undefined8 *)((long)local_a8 - 1);
      pvVar14 = (void *)((long)puVar11 * size + (long)ptr);
      memcpy(&local_98,ptr,uVar18);
      memmove(ptr,pvVar14,uVar18);
      memcpy(pvVar14,&local_98,uVar18);
      if (local_a8 == (undefined8 *)0x2) {
        return;
      }
      local_50 = (undefined8 *)((ulong)puVar11 >> 1);
      puVar12 = (undefined8 *)0x0;
      local_58 = puVar15;
      do {
        uVar18 = (long)puVar12 * 2;
        puVar15 = (undefined8 *)((long)puVar12 * 2 + 2);
        if (puVar15 < puVar11) {
          pvVar14 = (void *)((long)puVar15 * size + (long)ptr);
          lVar19 = (uVar18 | 1) * size;
          local_40 = puVar15;
          iVar10 = (*cmp)(pvVar14,(void *)((long)ptr + lVar19),local_48);
          if (iVar10 < 0) goto LAB_00118736;
          pvVar16 = (void *)((long)puVar12 * size + (long)ptr);
          iVar10 = (*cmp)(pvVar14,pvVar16,local_48);
          if (iVar10 < 1) break;
          sVar21 = size;
          if (0x40 < size) {
            lVar19 = (uVar18 + 3) * size;
            lVar17 = ((long)puVar12 + 1) * size;
            lVar20 = 0;
            do {
              puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x40);
              local_98 = *puVar15;
              uStack_90 = puVar15[1];
              puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x30);
              local_88 = *puVar15;
              uStack_80 = puVar15[1];
              puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x20);
              local_78 = *puVar15;
              uStack_70 = puVar15[1];
              puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x10);
              local_68 = *puVar15;
              uStack_60 = puVar15[1];
              puVar12 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x40);
              uVar3 = puVar12[1];
              puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x30);
              uVar4 = *puVar15;
              uVar5 = puVar15[1];
              puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x20);
              uVar6 = *puVar15;
              uVar7 = puVar15[1];
              puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x10);
              uVar8 = *puVar15;
              uVar9 = puVar15[1];
              puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x40);
              *puVar15 = *puVar12;
              puVar15[1] = uVar3;
              puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x10);
              *puVar15 = uVar8;
              puVar15[1] = uVar9;
              puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x20);
              *puVar15 = uVar6;
              puVar15[1] = uVar7;
              puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar17 + -0x30);
              *puVar15 = uVar4;
              puVar15[1] = uVar5;
              puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x10);
              *puVar15 = local_68;
              puVar15[1] = uStack_60;
              puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x20);
              *puVar15 = local_78;
              puVar15[1] = uStack_70;
              puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x30);
              *puVar15 = local_88;
              puVar15[1] = uStack_80;
              puVar15 = (undefined8 *)((long)ptr + lVar20 + lVar19 + -0x40);
              *puVar15 = local_98;
              puVar15[1] = uStack_90;
              lVar1 = size + lVar20;
              lVar20 = lVar20 + -0x40;
            } while (0x40 < lVar1 - 0x40U);
            sVar21 = lVar20 + size;
          }
          memcpy(&local_98,pvVar16,sVar21);
          memmove(pvVar16,pvVar14,sVar21);
          memcpy(pvVar14,&local_98,sVar21);
          puVar12 = local_40;
        }
        else {
          lVar19 = (uVar18 | 1) * size;
LAB_00118736:
          local_b0 = (undefined8 *)(uVar18 | 1);
          pvVar14 = (void *)((long)ptr + lVar19);
          pvVar16 = (void *)((long)puVar12 * size + (long)ptr);
          iVar10 = (*cmp)(pvVar14,pvVar16,local_48);
          if (iVar10 < 1) break;
          uVar18 = size;
          if (0x40 < size) {
            puVar15 = (undefined8 *)((long)ptr + ((long)puVar12 + 1) * size + -0x40);
            sVar21 = size;
            do {
              uVar18 = sVar21 - 0x40;
              local_98 = *puVar15;
              uStack_90 = puVar15[1];
              local_88 = puVar15[2];
              uStack_80 = puVar15[3];
              local_78 = puVar15[4];
              uStack_70 = puVar15[5];
              local_68 = puVar15[6];
              uStack_60 = puVar15[7];
              puVar12 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x40);
              uVar3 = puVar12[1];
              puVar2 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x30);
              uVar4 = *puVar2;
              uVar5 = puVar2[1];
              puVar2 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x20);
              uVar6 = *puVar2;
              uVar7 = puVar2[1];
              puVar2 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x10);
              uVar8 = *puVar2;
              uVar9 = puVar2[1];
              *puVar15 = *puVar12;
              puVar15[1] = uVar3;
              puVar15[6] = uVar8;
              puVar15[7] = uVar9;
              puVar15[4] = uVar6;
              puVar15[5] = uVar7;
              puVar15[2] = uVar4;
              puVar15[3] = uVar5;
              puVar12 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x10);
              *puVar12 = local_68;
              puVar12[1] = uStack_60;
              puVar12 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x20);
              *puVar12 = local_78;
              puVar12[1] = uStack_70;
              puVar12 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x30);
              *puVar12 = local_88;
              puVar12[1] = uStack_80;
              puVar12 = (undefined8 *)((long)ptr + sVar21 + lVar19 + -0x40);
              *puVar12 = local_98;
              puVar12[1] = uStack_90;
              puVar15 = puVar15 + -8;
              sVar21 = uVar18;
            } while (0x40 < uVar18);
          }
          memcpy(&local_98,pvVar16,uVar18);
          memmove(pvVar16,pvVar14,uVar18);
          memcpy(pvVar14,&local_98,uVar18);
          puVar12 = local_b0;
        }
      } while (puVar12 < local_50);
      puVar15 = (undefined8 *)((long)local_58 + local_38);
      local_a8 = puVar11;
    } while ((undefined8 *)0x1 < puVar11);
  }
  return;
}

Assistant:

static void secp256k1_hsort(void *ptr, size_t count, size_t size,
                            int (*cmp)(const void *, const void *, void *),
                            void *cmp_data) {
    size_t i;

    for (i = count/2; 0 < i; --i) {
        secp256k1_heap_down(ptr, i-1, count, size, cmp, cmp_data);
    }
    for (i = count; 1 < i; --i) {
        /* Extract the largest value from the heap */
        secp256k1_heap_swap(ptr, 0, i-1, size);

        /* Repair the heap condition */
        secp256k1_heap_down(ptr, 0, i-1, size, cmp, cmp_data);
    }
}